

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_success_enoughCapacityBufferNull_fn(int _i)

{
  bool bVar1;
  size_t *psVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  size_t local_20;
  size_t local_18;
  long local_10;
  
  local_38 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_30 = private_ACUtilsTest_ADynArray_free;
  local_20 = 0;
  local_28 = private_ACUtilsTest_ADynArray_growStrategy;
  local_18 = 8;
  local_10 = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_40 = 0x10b09a;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_38,8,false,1);
  if (bVar1 == true) {
    uStack_40 = 0x10b0b4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xdd);
    if (local_20 != 0) {
      psVar2 = &local_58;
      local_50 = "0";
      local_58 = local_20;
      pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar5 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.size == 0";
      pcVar6 = "array.size";
      iVar3 = 0xde;
      goto LAB_0010b27f;
    }
    uStack_40 = 0x10b0d3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xde);
    if (local_18 != 8) {
      local_50 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar7 = "array.capacity";
      iVar3 = 0xdf;
      local_48 = 8;
      local_58 = local_18;
      goto LAB_0010b2bb;
    }
    uStack_40 = 0x10b0f3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xdf);
    if (local_10 == 0) {
      psVar2 = &local_48;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar5 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) array.buffer != NULL";
      pcVar6 = "(void*) array.buffer";
      iVar3 = 0xe0;
LAB_0010b27f:
      uStack_40 = 0;
      local_48 = 0;
      *(undefined8 *)((long)psVar2 + -8) = 0x10b286;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar3,pcVar7,pcVar5,pcVar4,pcVar6);
    }
    uStack_40 = 0x10b110;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xe0);
    if (local_28 == (code *)0x0) {
      psVar2 = &local_48;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar5 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) array.growStrategy != NULL";
      pcVar6 = "(void*) array.growStrategy";
      iVar3 = 0xe1;
      goto LAB_0010b27f;
    }
    uStack_40 = 0x10b12d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xe1);
    if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
      uStack_40 = 0x10b14f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xe2);
      uStack_40 = 0x10b158;
      (*pcStack_30)(local_10);
      return;
    }
    local_50 = "1";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
    pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar3 = 0xe2;
    local_58 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    local_58 = (size_t)bVar1;
    local_50 = "true";
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar7 = 
    "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer))";
    iVar3 = 0xdd;
  }
  local_48 = 1;
LAB_0010b2bb:
  uStack_40 = 0;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar3,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar5,pcVar7);
}

Assistant:

START_TEST(test_ADynArray_reserve_success_enoughCapacityBufferNull)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 0;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    array.buffer = nullptr;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, array.capacity), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}